

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

size_t ftxui::GlyphNext(string *input,size_t start)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  size_t unaff_R15;
  uint32_t codepoint;
  size_t end;
  uint32_t local_3c;
  size_t local_38;
  
  uVar1 = input->_M_string_length;
  if (start < uVar1) {
    bVar2 = false;
    do {
      local_38 = 0;
      local_3c = 0;
      bVar3 = EatCodePoint(input,start,&local_38,&local_3c);
      if ((bVar3) && (local_3c != 0)) {
        bVar3 = local_3c - 0x7f < 0x21;
        if (local_3c < 0x20) {
          bVar3 = local_3c != 10;
        }
        if ((bVar3) || (bVar3 = IsCombining(local_3c), bVar3)) goto LAB_0010cab1;
        if (!bVar2) {
          bVar2 = true;
          goto LAB_0010cab1;
        }
        unaff_R15 = (size_t)(int)start;
        bVar3 = true;
      }
      else {
LAB_0010cab1:
        bVar3 = false;
        start = local_38;
      }
      if (bVar3) {
        return unaff_R15;
      }
    } while (start < uVar1);
  }
  return (long)(int)uVar1;
}

Assistant:

size_t GlyphNext(const std::string& input, size_t start) {
  bool glyph_found = false;
  while (start < input.size()) {
    size_t end = 0;
    uint32_t codepoint = 0;
    const bool eaten = EatCodePoint(input, start, &end, &codepoint);

    // Ignore invalid, control characters and combining characters.
    if (!eaten || IsControl(codepoint) || IsCombining(codepoint)) {
      start = end;
      continue;
    }

    // We eat the beginning of the next glyph. If we are eating the one
    // requested, return its start position immediately.
    if (glyph_found) {
      return static_cast<int>(start);
    }

    // Otherwise, skip this glyph and iterate:
    glyph_found = true;
    start = end;
  }
  return static_cast<int>(input.size());
}